

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O0

string * __thiscall
cppforth::Forth::GetFileName
          (string *__return_storage_ptr__,Forth *this,Cell handler,string *function,errorCodes ec)

{
  bool bVar1;
  reference pFVar2;
  ulong uVar3;
  undefined8 uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  __normal_iterator<cppforth::Forth::ForthFile_*,_std::vector<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>_>
  local_40;
  __normal_iterator<cppforth::Forth::ForthFile_*,_std::vector<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>_>
  local_38;
  iterator it;
  errorCodes ec_local;
  string *function_local;
  Cell handler_local;
  Forth *this_local;
  
  it._M_current._4_4_ = ec;
  local_38._M_current =
       (ForthFile *)
       std::vector<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>::begin
                 (&this->OpenFiles);
  do {
    local_40._M_current =
         (ForthFile *)
         std::vector<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>::end
                   (&this->OpenFiles);
    bVar1 = __gnu_cxx::
            operator==<cppforth::Forth::ForthFile_*,_std::vector<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>_>
                      (&local_38,&local_40);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::operator+(&local_60,function,": wrong file handler access");
      throwMessage(this,&local_60,it._M_current._4_4_);
      std::__cxx11::string::~string((string *)&local_60);
      uVar4 = __cxa_rethrow();
      std::__cxx11::string::~string((string *)&local_60);
      _Unwind_Resume(uVar4);
    }
    pFVar2 = __gnu_cxx::
             __normal_iterator<cppforth::Forth::ForthFile_*,_std::vector<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>_>
             ::operator*(&local_38);
    if (pFVar2->FILE == handler) {
      pFVar2 = __gnu_cxx::
               __normal_iterator<cppforth::Forth::ForthFile_*,_std::vector<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>_>
               ::operator*(&local_38);
      std::
      __shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)&pFVar2->fileObject);
      uVar3 = std::fstream::is_open();
      if ((uVar3 & 1) != 0) {
        pFVar2 = __gnu_cxx::
                 __normal_iterator<cppforth::Forth::ForthFile_*,_std::vector<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>_>
                 ::operator*(&local_38);
        std::__cxx11::string::string((string *)__return_storage_ptr__,&pFVar2->fileName);
        return __return_storage_ptr__;
      }
    }
    __gnu_cxx::
    __normal_iterator<cppforth::Forth::ForthFile_*,_std::vector<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>_>
    ::operator++(&local_38);
  } while( true );
}

Assistant:

std::string GetFileName(Cell handler, const std::string& function, errorCodes ec = errorAbort) {
	for (auto it = OpenFiles.begin(); it != OpenFiles.end(); ++it) {
		if ((*it).FILE == handler && (*it).fileObject->is_open()) {
			return (*it).fileName;
		}
	}
	throwMessage(function + ": wrong file handler access", ec);
	throw;
}